

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

void __thiscall QtMWidgets::Switch::mouseMoveEvent(Switch *this,QMouseEvent *event)

{
  SwitchPrivate *pSVar1;
  int iVar2;
  QPoint QVar3;
  int iVar4;
  QRect QVar5;
  
  if (((this->d).d)->leftMouseButtonPressed == true) {
    QVar3 = QMouseEvent::pos(event);
    pSVar1 = (this->d).d;
    iVar2 = QVar3.xp - (pSVar1->mousePos).xp;
    pSVar1->offset = pSVar1->offset + iVar2;
    iVar4 = -iVar2;
    if (0 < iVar2) {
      iVar4 = iVar2;
    }
    pSVar1->mouseMoveDelta = pSVar1->mouseMoveDelta + iVar4;
    QVar3 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar3;
    pSVar1 = (this->d).d;
    iVar4 = pSVar1->offset;
    if (iVar4 < 0) {
      pSVar1->offset = 0;
    }
    else {
      QVar5 = QWidget::rect(&this->super_QWidget);
      if (~QVar5.x1 + QVar5.x2 + ((this->d).d)->radius * -2 < iVar4) {
        QVar5 = QWidget::rect(&this->super_QWidget);
        pSVar1 = (this->d).d;
        pSVar1->offset = ~QVar5.x1 + QVar5.x2 + pSVar1->radius * -2;
      }
    }
    QWidget::update();
  }
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void
Switch::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().x() - d->mousePos.x();
		d->offset += delta;
		d->mouseMoveDelta += qAbs( delta );
		d->mousePos = event->pos();

		if( d->offset < 0 )
			d->offset = 0;
		else if( d->offset > rect().width() - d->radius * 2 - 2 )
			d->offset = rect().width() - d->radius * 2 - 2;

		update();
	}

	event->accept();
}